

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_parse_data_fd(ly_ctx *ctx,int fd,LYD_FORMAT format,uint32_t parse_options,
                        uint32_t validate_options,lyd_node **tree)

{
  ly_in *plStack_40;
  LY_ERR ret__;
  ly_in *in;
  lyd_node **pplStack_30;
  LY_ERR ret;
  lyd_node **tree_local;
  uint32_t validate_options_local;
  uint32_t parse_options_local;
  LYD_FORMAT format_local;
  int fd_local;
  ly_ctx *ctx_local;
  
  pplStack_30 = tree;
  tree_local._0_4_ = validate_options;
  tree_local._4_4_ = parse_options;
  validate_options_local = format;
  parse_options_local = fd;
  _format_local = ctx;
  ctx_local._4_4_ = ly_in_new_fd(fd,&stack0xffffffffffffffc0);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    in._4_4_ = lyd_parse_data(_format_local,(lyd_node *)0x0,plStack_40,validate_options_local,
                              tree_local._4_4_,(uint32_t)tree_local,pplStack_30);
    ly_in_free(plStack_40,'\0');
    ctx_local._4_4_ = in._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_parse_data_fd(const struct ly_ctx *ctx, int fd, LYD_FORMAT format, uint32_t parse_options, uint32_t validate_options,
        struct lyd_node **tree)
{
    LY_ERR ret;
    struct ly_in *in;

    LY_CHECK_RET(ly_in_new_fd(fd, &in));
    ret = lyd_parse_data(ctx, NULL, in, format, parse_options, validate_options, tree);

    ly_in_free(in, 0);
    return ret;
}